

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O0

void __thiscall
kj::ExceptionSafeArrayUtil::construct
          (ExceptionSafeArrayUtil *this,size_t count,_func_void_void_ptr *constructElement)

{
  _func_void_void_ptr *constructElement_local;
  size_t count_local;
  ExceptionSafeArrayUtil *this_local;
  
  for (constructElement_local = (_func_void_void_ptr *)count;
      constructElement_local != (_func_void_void_ptr *)0x0;
      constructElement_local = constructElement_local + -1) {
    (*constructElement)(this->pos);
    this->pos = this->pos + this->elementSize;
    this->constructedElementCount = this->constructedElementCount + 1;
  }
  return;
}

Assistant:

void ExceptionSafeArrayUtil::construct(size_t count, void (*constructElement)(void*)) {
  while (count > 0) {
    constructElement(pos);
    pos += elementSize;
    ++constructedElementCount;
    --count;
  }
}